

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O3

void __thiscall duckdb::Optimizer::Optimizer(Optimizer *this,Binder *binder,ClientContext *context)

{
  ExpressionRewriter *rewriter;
  vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_true> *this_00;
  Rule *pRVar1;
  TimeStampComparison *this_01;
  _Head_base<0UL,_duckdb::Rule_*,_false> local_30;
  
  this->context = context;
  this->binder = binder;
  rewriter = &this->rewriter;
  (this->rewriter).super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
       (_func_int **)&PTR__ExpressionRewriter_0197b0b8;
  (this->rewriter).rules.
  super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewriter).rules.
  super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewriter).rules.
  super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rewriter).context = context;
  (this->rewriter).op.ptr = (LogicalOperator *)0x0;
  (this->rewriter).to_apply_rules.
  super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewriter).to_apply_rules.
  super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewriter).to_apply_rules.
  super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  pRVar1 = (Rule *)operator_new(0x18);
  ConstantFoldingRule::ConstantFoldingRule((ConstantFoldingRule *)pRVar1,rewriter);
  this_00 = &(this->rewriter).rules;
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  DistributivityRule::DistributivityRule((DistributivityRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  ArithmeticSimplificationRule::ArithmeticSimplificationRule
            ((ArithmeticSimplificationRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  CaseSimplificationRule::CaseSimplificationRule((CaseSimplificationRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  ConjunctionSimplificationRule::ConjunctionSimplificationRule
            ((ConjunctionSimplificationRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  DatePartSimplificationRule::DatePartSimplificationRule
            ((DatePartSimplificationRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  ComparisonSimplificationRule::ComparisonSimplificationRule
            ((ComparisonSimplificationRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  InClauseSimplificationRule::InClauseSimplificationRule
            ((InClauseSimplificationRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  EqualOrNullSimplification::EqualOrNullSimplification((EqualOrNullSimplification *)pRVar1,rewriter)
  ;
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  MoveConstantsRule::MoveConstantsRule((MoveConstantsRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  LikeOptimizationRule::LikeOptimizationRule((LikeOptimizationRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  OrderedAggregateOptimizer::OrderedAggregateOptimizer((OrderedAggregateOptimizer *)pRVar1,rewriter)
  ;
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  DistinctAggregateOptimizer::DistinctAggregateOptimizer
            ((DistinctAggregateOptimizer *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  DistinctWindowedOptimizer::DistinctWindowedOptimizer((DistinctWindowedOptimizer *)pRVar1,rewriter)
  ;
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  RegexOptimizationRule::RegexOptimizationRule((RegexOptimizationRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  EmptyNeedleRemovalRule::EmptyNeedleRemovalRule((EmptyNeedleRemovalRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  EnumComparisonRule::EnumComparisonRule((EnumComparisonRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  pRVar1 = (Rule *)operator_new(0x18);
  JoinDependentFilterRule::JoinDependentFilterRule((JoinDependentFilterRule *)pRVar1,rewriter);
  local_30._M_head_impl = pRVar1;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if (local_30._M_head_impl != (Rule *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  this_01 = (TimeStampComparison *)operator_new(0x20);
  TimeStampComparison::TimeStampComparison(this_01,context,rewriter);
  local_30._M_head_impl = (Rule *)this_01;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_30);
  if ((TimeStampComparison *)local_30._M_head_impl != (TimeStampComparison *)0x0) {
    (*((Rule *)&(local_30._M_head_impl)->_vptr_Rule)->_vptr_Rule[1])();
  }
  return;
}

Assistant:

Optimizer::Optimizer(Binder &binder, ClientContext &context) : context(context), binder(binder), rewriter(context) {
	rewriter.rules.push_back(make_uniq<ConstantFoldingRule>(rewriter));
	rewriter.rules.push_back(make_uniq<DistributivityRule>(rewriter));
	rewriter.rules.push_back(make_uniq<ArithmeticSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<CaseSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<ConjunctionSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<DatePartSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<ComparisonSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<InClauseSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<EqualOrNullSimplification>(rewriter));
	rewriter.rules.push_back(make_uniq<MoveConstantsRule>(rewriter));
	rewriter.rules.push_back(make_uniq<LikeOptimizationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<OrderedAggregateOptimizer>(rewriter));
	rewriter.rules.push_back(make_uniq<DistinctAggregateOptimizer>(rewriter));
	rewriter.rules.push_back(make_uniq<DistinctWindowedOptimizer>(rewriter));
	rewriter.rules.push_back(make_uniq<RegexOptimizationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<EmptyNeedleRemovalRule>(rewriter));
	rewriter.rules.push_back(make_uniq<EnumComparisonRule>(rewriter));
	rewriter.rules.push_back(make_uniq<JoinDependentFilterRule>(rewriter));
	rewriter.rules.push_back(make_uniq<TimeStampComparison>(context, rewriter));

#ifdef DEBUG
	for (auto &rule : rewriter.rules) {
		// root not defined in rule
		D_ASSERT(rule->root);
	}
#endif
}